

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GetNumBitsForMessage
          (ImmutableStringFieldLiteGenerator *this)

{
  FieldDescriptor *this_00;
  OneofDescriptor *pOVar1;
  bool bVar2;
  uint uVar3;
  
  this_00 = this->descriptor_;
  bVar2 = FieldDescriptor::has_presence(this_00);
  uVar3 = 0;
  if (bVar2) {
    if ((this_00->field_0x3 & 1) != 0) {
      if ((this_00->field_0x1 & 0x10) == 0) {
LAB_0034cc1f:
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb63);
      }
      pOVar1 = (this_00->scope_).containing_oneof;
      if (pOVar1 == (OneofDescriptor *)0x0) {
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
      if ((pOVar1->field_count_ == 1) && ((pOVar1->fields_->field_0x1 & 2) != 0)) {
        GetNumBitsForMessage();
        goto LAB_0034cc1f;
      }
    }
    uVar3 = (byte)~this_00->field_0x3 & 1;
  }
  return uVar3;
}

Assistant:

int ImmutableStringFieldLiteGenerator::GetNumBitsForMessage() const {
  return HasHasbit(descriptor_) ? 1 : 0;
}